

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

void __thiscall TadsListenerThread::list_threads(TadsListenerThread *this,NetString *buf)

{
  uint uVar1;
  StringRef *this_00;
  char *pcVar2;
  TadsServerThread *in_RSI;
  long in_RDI;
  StringRef *state;
  TadsServerThread *cur;
  TadsServerThread *in_stack_ffffffffffffffc0;
  long local_18;
  
  OS_Mutex::lock((OS_Mutex *)0x25ed24);
  for (local_18 = *(long *)(in_RDI + 0x78); local_18 != 0; local_18 = *(long *)(local_18 + 0x58)) {
    this_00 = TadsServerThread::get_state(in_stack_ffffffffffffffc0);
    uVar1 = *(uint *)(local_18 + 0x40);
    in_stack_ffffffffffffffc0 = in_RSI;
    pcVar2 = StringRef::get(this_00);
    NetString::appendf((NetString *)in_stack_ffffffffffffffc0,
                       "Thread ID=%d (thread object=%lx): %s<br>",(ulong)uVar1,local_18,pcVar2);
    CVmRefCntObj::release_ref((CVmRefCntObj *)in_stack_ffffffffffffffc0);
  }
  OS_Mutex::unlock((OS_Mutex *)0x25edbd);
  return;
}

Assistant:

void TadsListenerThread::list_threads(NetString *buf)
{
    /* protect against concurrent access */
    mutex->lock();

    /* scan threads */
    for (TadsServerThread *cur = servers ; cur != 0 ; cur = cur->next_server)
    {
        /* report on this thread */
        StringRef *state = cur->get_state();
        buf->appendf("Thread ID=%d (thread object=%lx): %s<br>",
                     cur->thread_id, (unsigned long)cur, state->get());

        /* done with the state string */
        state->release_ref();
    }

    /* done with concurrent access protection */
    mutex->unlock();
}